

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::matroska_parse_cluster(MatroskaDemuxer *this)

{
  int *levelUp;
  int64_t pos;
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int64_t cluster_time;
  int in_stack_ffffffffffffffa0;
  int size;
  int64_t num;
  uint8_t *data;
  uint32_t local_34;
  
  levelUp = &this->level_up;
  iVar2 = 0;
  cluster_time = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = ebml_peek_id(this,levelUp);
    if (uVar1 == 0) {
      return -1;
    }
    iVar3 = *levelUp;
    if (iVar3 != 0) {
      iVar2 = 0;
      break;
    }
    if (uVar1 == 0xa0) {
      iVar2 = ebml_read_master(this,&local_34);
      if (-1 < iVar2) {
        iVar2 = matroska_parse_blockgroup(this,cluster_time);
      }
    }
    else if (uVar1 == 0xa3) {
      pos = (this->super_IOContextDemuxer).m_processedBytes;
      iVar2 = ebml_read_binary(this,&local_34,&data,&size);
      if (iVar2 == 0) {
        iVar2 = matroska_parse_block
                          (this,data,size,pos,cluster_time,-0x8000000000000000,-1,
                           in_stack_ffffffffffffffa0);
      }
    }
    else {
      if (uVar1 != 0xbf) {
        if (uVar1 == 0xe7) {
          iVar2 = ebml_read_uint(this,&local_34,&num);
          if (-1 < iVar2) {
            cluster_time = num;
          }
          goto LAB_001ac784;
        }
        if ((uVar1 != 0xec) && (uVar1 == 0x1f43b675)) {
          return 0;
        }
      }
      iVar2 = ebml_read_skip(this);
    }
LAB_001ac784:
    iVar3 = *levelUp;
  } while (iVar3 == 0);
  *levelUp = iVar3 + -1;
  return iVar2;
}

Assistant:

int MatroskaDemuxer::matroska_parse_cluster()
{
    int res = 0;
    uint32_t id;
    int64_t cluster_time = 0;
    uint8_t *data;
    int64_t pos;
    int size;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* cluster timecode */
        case MATROSKA_ID_CLUSTERTIMECODE:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            cluster_time = num;
            break;
        }

        /* a group of blocks inside a cluster */
        case MATROSKA_ID_BLOCKGROUP:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_blockgroup(cluster_time);
            break;

        case MATROSKA_ID_SIMPLEBLOCK:
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            if (res == 0)
                res = matroska_parse_block(data, size, pos, cluster_time, AV_NOPTS_VALUE, -1, 0);
            break;

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        // Don't know why here is the next cluster without level up. Probably file error
        // TODO: does the EBML need to be skipped ?
        case MATROSKA_ID_CLUSTER:
            return 0;
        default:
            LTRACE(LT_WARN, 0, "Unknown entry " << id << " in cluster data");
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}